

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DramAnalyzer.cpp
# Opt level: O1

void __thiscall DramAnalyzer::DramAnalyzer(DramAnalyzer *this,char *target)

{
  uint uVar1;
  long lVar2;
  size_t __i;
  ulong uVar3;
  undefined1 local_2770 [8];
  random_device rd;
  vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  local_60;
  value_type local_48;
  allocator_type local_21;
  
  (this->bank_rank_functions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bank_rank_functions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bank_rank_functions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->row_function = 0;
  this->start_address = target;
  (this->gen)._M_x[0] = 0x1571;
  uVar3 = 0x1571;
  lVar2 = 9;
  do {
    uVar3 = (ulong)((((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2) - 8);
    (this->gen)._M_x[lVar2 + -8] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x278);
  (this->gen)._M_p = 0x270;
  (this->dist)._M_param = (param_type)0x7fffffff00000000;
  std::random_device::random_device((random_device *)local_2770);
  uVar1 = std::random_device::_M_getval();
  rd.field_0._M_mt._M_p = (size_t)uVar1;
  lVar2 = 1;
  uVar3 = rd.field_0._M_mt._M_p;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    *(ulong *)((long)&rd.field_0 + lVar2 * 8 + 0x1380) = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  memcpy(&this->gen,(void *)((long)&rd.field_0 + 0x1380),5000);
  (this->dist)._M_param = (param_type)0x7fffffff00000000;
  local_48.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ::vector(&local_60,0x10,&local_48,&local_21);
  rd.field_0._M_mt._M_p =
       (size_t)(this->banks).
               super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_60.
       super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_60.
       super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->banks).
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_60.
       super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_60.
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ::~vector((vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
             *)((long)&rd.field_0 + 0x1380));
  std::
  vector<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>,_std::allocator<std::vector<volatile_char_*,_std::allocator<volatile_char_*>_>_>_>
  ::~vector(&local_60);
  if (local_48.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<volatile_char_*,_std::allocator<volatile_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

DramAnalyzer::DramAnalyzer(volatile char *target) :
  row_function(0), start_address(target) {
  std::random_device rd;
  gen = std::mt19937(rd());
  dist = std::uniform_int_distribution<>(0, std::numeric_limits<int>::max());
  banks = std::vector<std::vector<volatile char *>>(NUM_BANKS, std::vector<volatile char *>());
}